

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O0

void __thiscall re2c::RuleOp::display(RuleOp *this,ostream *o)

{
  ostream *poVar1;
  ostream *o_local;
  RuleOp *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(o,this->exp);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ctx);
  std::operator<<(poVar1,";");
  return;
}

Assistant:

void RuleOp::display (std::ostream & o) const
{
	o << exp << "/" << ctx << ";";
}